

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DTDScanner::scanTextDecl(DTDScanner *this)

{
  XMLCh XVar1;
  XMLBufferMgr *this_00;
  XMLSize_t XVar2;
  XMLCh *pXVar3;
  XMLBufferMgr *this_01;
  ReaderMgr *pRVar4;
  DocTypeHandler *pDVar5;
  XMLReader *this_02;
  bool bVar6;
  bool bVar7;
  XMLCh XVar8;
  XMLBuffer *toFill;
  XMLBuffer *toFill_00;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  XMLScanner *pXVar11;
  XMLBufBid bbEncoding;
  XMLBufBid bbVersion;
  
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  this_00 = this->fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_00);
  bVar6 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"version");
  if (!bVar6) goto LAB_00309c8c;
  bVar6 = scanEq(this);
  if (!bVar6) {
    XMLScanner::emitError(this->fScanner,ExpectedEqSign);
    pRVar4 = this->fReaderMgr;
    do {
      XVar8 = ReaderMgr::getNextChar(pRVar4);
      if (XVar8 == L'\0') break;
    } while (XVar8 != L'>');
    goto LAB_00309e15;
  }
  bVar6 = getQuotedString(this,toFill);
  if (!bVar6) {
    XMLScanner::emitError(this->fScanner,BadXMLVersion);
    pRVar4 = this->fReaderMgr;
    do {
      XVar8 = ReaderMgr::getNextChar(pRVar4);
      if (XVar8 == L'\0') break;
    } while (XVar8 != L'>');
    goto LAB_00309e15;
  }
  XVar2 = toFill->fIndex;
  pXVar3 = toFill->fBuffer;
  pXVar3[XVar2] = L'\0';
  if (pXVar3 == L"1.1") {
LAB_00309c5b:
    pXVar11 = this->fScanner;
    if (pXVar11->fXMLVersion != XMLV1_1) goto LAB_00309c74;
  }
  else {
    pXVar9 = L"1.1";
    pXVar10 = pXVar3;
    if (pXVar3 == (XMLCh *)0x0) {
LAB_00309c1d:
      if (*pXVar9 == L'\0') goto LAB_00309c5b;
    }
    else {
      do {
        XVar8 = *pXVar10;
        if (XVar8 == L'\0') goto LAB_00309c1d;
        XVar1 = *pXVar9;
        pXVar9 = pXVar9 + 1;
        pXVar10 = pXVar10 + 1;
      } while (XVar8 == XVar1);
    }
    pXVar3[XVar2] = L'\0';
    if (pXVar3 != L"1.0") {
      pXVar9 = L"1.0";
      pXVar10 = pXVar3;
      if (pXVar3 == (XMLCh *)0x0) {
LAB_00309c6a:
        if (*pXVar9 == L'\0') goto LAB_00309c8c;
      }
      else {
        do {
          XVar8 = *pXVar10;
          if (XVar8 == L'\0') goto LAB_00309c6a;
          XVar1 = *pXVar9;
          pXVar9 = pXVar9 + 1;
          pXVar10 = pXVar10 + 1;
        } while (XVar8 == XVar1);
      }
      pXVar11 = this->fScanner;
LAB_00309c74:
      pXVar3[XVar2] = L'\0';
      XMLScanner::emitError
                (pXVar11,UnsupportedXMLVersion,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
LAB_00309c8c:
  this_01 = this->fBufMgr;
  toFill_00 = XMLBufferMgr::bidOnBuffer(this_01);
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  bVar6 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"encoding");
  if (bVar6) {
    bVar7 = scanEq(this);
    if (bVar7) {
      getQuotedString(this,toFill_00);
      if (toFill_00->fIndex != 0) {
        pXVar3 = toFill_00->fBuffer;
        pXVar3[toFill_00->fIndex] = L'\0';
        bVar7 = XMLString::isValidEncName(pXVar3);
        if (bVar7) {
          if (!bVar6) goto LAB_00309d75;
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
          bVar6 = ReaderMgr::skippedChar(this->fReaderMgr,L'?');
          if (bVar6) {
            bVar6 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
            if (!bVar6) {
              XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
              pRVar4 = this->fReaderMgr;
              do {
                XVar8 = ReaderMgr::getNextChar(pRVar4);
                if (XVar8 == L'>') break;
              } while (XVar8 != L'\0');
            }
          }
          else {
            XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
            pRVar4 = this->fReaderMgr;
            do {
              XVar8 = ReaderMgr::getNextChar(pRVar4);
              if (XVar8 == L'\0') break;
            } while (XVar8 != L'>');
          }
          pDVar5 = this->fDocTypeHandler;
          if (pDVar5 != (DocTypeHandler *)0x0) {
            toFill->fBuffer[toFill->fIndex] = L'\0';
            toFill_00->fBuffer[toFill_00->fIndex] = L'\0';
            (*pDVar5->_vptr_DocTypeHandler[0x11])();
          }
          if (toFill_00->fIndex != 0) {
            this_02 = this->fReaderMgr->fCurReader;
            pXVar3 = toFill_00->fBuffer;
            pXVar3[toFill_00->fIndex] = L'\0';
            bVar6 = XMLReader::setEncoding(this_02,pXVar3);
            if (!bVar6) {
              pXVar11 = this->fScanner;
              pXVar3 = toFill_00->fBuffer;
              pXVar3[toFill_00->fIndex] = L'\0';
              XMLScanner::emitError
                        (pXVar11,ContradictoryEncoding,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                        );
            }
          }
          goto LAB_00309e07;
        }
      }
      pXVar11 = this->fScanner;
      pXVar3 = toFill_00->fBuffer;
      pXVar3[toFill_00->fIndex] = L'\0';
      XMLScanner::emitError(pXVar11,BadXMLEncoding,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      pRVar4 = this->fReaderMgr;
      do {
        XVar8 = ReaderMgr::getNextChar(pRVar4);
        if (XVar8 == L'\0') break;
      } while (XVar8 != L'>');
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedEqSign);
      pRVar4 = this->fReaderMgr;
      do {
        XVar8 = ReaderMgr::getNextChar(pRVar4);
        if (XVar8 == L'\0') break;
      } while (XVar8 != L'>');
    }
  }
  else {
LAB_00309d75:
    XMLScanner::emitError(this->fScanner,EncodingRequired);
    pRVar4 = this->fReaderMgr;
    do {
      XVar8 = ReaderMgr::getNextChar(pRVar4);
      if (XVar8 == L'\0') break;
    } while (XVar8 != L'>');
  }
LAB_00309e07:
  XMLBufferMgr::releaseBuffer(this_01,toFill_00);
LAB_00309e15:
  XMLBufferMgr::releaseBuffer(this_00,toFill);
  return;
}

Assistant:

void DTDScanner::scanTextDecl()
{
    // Skip any subsequent whitespace before the version string
    fReaderMgr->skipPastSpaces();

    // Next should be the version string
    XMLBufBid bbVersion(fBufMgr);
    if (fReaderMgr->skippedString(XMLUni::fgVersionString))
    {
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        //
        //  Followed by a single or double quoted version. Get a buffer for
        //  the string.
        //
        if (!getQuotedString(bbVersion.getBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLVersion);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // If its not our supported version, issue an error but continue
        if (XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_1)) {
            if (fScanner->getXMLVersion() != XMLReader::XMLV1_1)
        	    fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
        }
        else if (!XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_0))
            fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
    }

    // Ok, now we must have an encoding string
    XMLBufBid bbEncoding(fBufMgr);
    fReaderMgr->skipPastSpaces();
    bool gotEncoding = false;
    if (fReaderMgr->skippedString(XMLUni::fgEncodingString))
    {
        // There must be a equal sign next
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Followed by a single or double quoted version string
        getQuotedString(bbEncoding.getBuffer());
        if (bbEncoding.isEmpty() || !XMLString::isValidEncName(bbEncoding.getRawBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLEncoding, bbEncoding.getRawBuffer());
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Indicate that we got an encoding
        gotEncoding = true;
    }

    //
    // Encoding declarations are required in the external entity
    // if there is a text declaration present
    //
    if (!gotEncoding)
    {
      fScanner->emitError(XMLErrs::EncodingRequired);
      fReaderMgr->skipPastChar(chCloseAngle);
      return;

    }

    fReaderMgr->skipPastSpaces();
    if (!fReaderMgr->skippedChar(chQuestion))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a document type handler and advanced callbacks are on,
    //  then call the TextDecl callback
    //
    if (fDocTypeHandler)
    {
        fDocTypeHandler->TextDecl
        (
            bbVersion.getRawBuffer()
            , bbEncoding.getRawBuffer()
        );
    }

    //
    //  If we got an encoding string, then we have to call back on the reader
    //  to tell it what the encoding is.
    //
    if (!bbEncoding.isEmpty())
    {
        if (!fReaderMgr->getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            fScanner->emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
    }
}